

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.h
# Opt level: O1

int __thiscall
mp::
FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
::Convert2Var(FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              *this,AffineExpr *ee)

{
  double value;
  double dVar1;
  anon_union_8_2_43b0091d_for_VarOrConst_1 value_00;
  int iVar2;
  VarOrConst VVar3;
  NodeRange NVar4;
  LinearFunctionalConstraint local_c0;
  
  value = ee->constant_term_;
  if ((((value != 0.0) || (NAN(value))) ||
      ((ee->super_LinTerms).coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
       super_small_vector_data_base<double_*,_unsigned_long>.m_size != 1)) ||
     ((dVar1 = *(ee->super_LinTerms).coefs_.super_small_vector_base<std::allocator<double>,_6U>.
                m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
      dVar1 != 1.0 || (NAN(dVar1))))) {
    if ((ee->super_LinTerms).coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
        super_small_vector_data_base<double_*,_unsigned_long>.m_size == 0) {
      NVar4 = MakeFixedVar(this,value);
      iVar2 = NVar4.ir_.beg_;
    }
    else {
      LinTerms::sort_terms(&ee->super_LinTerms,true);
      gch::detail::small_vector_base<std::allocator<double>,_6U>::shrink_to_size
                ((small_vector_base<std::allocator<double>,_6U> *)ee);
      gch::detail::small_vector_base<std::allocator<int>,_6U>::shrink_to_size
                (&(ee->super_LinTerms).vars_.super_small_vector_base<std::allocator<int>,_6U>);
      LinearFunctionalConstraint::LinearFunctionalConstraint(&local_c0,ee);
      VVar3 = AssignResult2Args<mp::LinearFunctionalConstraint>(this,&local_c0);
      value_00 = VVar3.field_1;
      if (((undefined1  [16])VVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        NVar4 = MakeFixedVar(this,value_00.c_);
        value_00 = (anon_union_8_2_43b0091d_for_VarOrConst_1)NVar4.ir_;
      }
      iVar2 = value_00.var_;
      if (6 < local_c0.affine_expr_.super_LinTerms.vars_.
              super_small_vector_base<std::allocator<int>,_6U>.m_data.
              super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
        operator_delete(local_c0.affine_expr_.super_LinTerms.vars_.
                        super_small_vector_base<std::allocator<int>,_6U>.m_data.
                        super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                        local_c0.affine_expr_.super_LinTerms.vars_.
                        super_small_vector_base<std::allocator<int>,_6U>.m_data.
                        super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
      }
      if (6 < local_c0.affine_expr_.super_LinTerms.coefs_.
              super_small_vector_base<std::allocator<double>,_6U>.m_data.
              super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
        operator_delete(local_c0.affine_expr_.super_LinTerms.coefs_.
                        super_small_vector_base<std::allocator<double>,_6U>.m_data.
                        super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                        local_c0.affine_expr_.super_LinTerms.coefs_.
                        super_small_vector_base<std::allocator<double>,_6U>.m_data.
                        super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p !=
          &local_c0.super_FunctionalConstraint.super_BasicConstraint.name_.field_2) {
        operator_delete(local_c0.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus.
                        _M_p,local_c0.super_FunctionalConstraint.super_BasicConstraint.name_.field_2
                             ._M_allocated_capacity + 1);
      }
    }
  }
  else {
    iVar2 = *(ee->super_LinTerms).vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr;
  }
  return iVar2;
}

Assistant:

int Convert2Var(AffineExpr&& ee) {
    if (ee.is_variable())
      return ee.get_representing_variable();
    if (ee.is_constant())
      return int( MakeFixedVar(ee.constant_term()) );
    ee.sort_terms();
    ee.shrink_to_fit();
    return AssignResultVar2Args(
            LinearFunctionalConstraint(std::move(ee)));
  }